

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-lib.cpp
# Opt level: O2

void __thiscall LibClass::LibClass(LibClass *this)

{
  double *pdVar1;
  LibInternalClass *this_00;
  
  (this->m_Str)._M_dataplus._M_p = (pointer)&(this->m_Str).field_2;
  (this->m_Str)._M_string_length = 0;
  (this->m_Str).field_2._M_local_buf[0] = '\0';
  (this->m_Vec).super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_Vec).super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_Vec).super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::assign((char *)this);
  this->m_Num = 1000;
  pdVar1 = (double *)operator_new(8);
  *pdVar1 = 1.2345;
  this->m_DoublePtr = pdVar1;
  this_00 = (LibInternalClass *)operator_new(8);
  LibInternalClass::LibInternalClass(this_00);
  this->m_InnerMember = this_00;
  return;
}

Assistant:

LibClass::LibClass() {
    m_Str = "TestClass2";
    m_Num = 1000;
    m_DoublePtr = new double(1.2345);
    m_InnerMember = new LibInternalClass();
}